

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_finalize_impl_(uint flags,event *ev,event_finalize_callback_fn cb)

{
  short *psVar1;
  event_base *peVar2;
  int iVar3;
  
  peVar2 = ev->ev_base;
  if (peVar2 == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_finalize_impl_");
    iVar3 = -1;
  }
  else {
    if (peVar2->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,peVar2->th_base_lock);
    }
    iVar3 = 0;
    event_del_nolock_(ev,0);
    (ev->ev_evcallback).evcb_closure = ((flags >> 0x10 & 1) != 0) + '\x05';
    (ev->ev_evcallback).evcb_cb_union.evcb_callback = (_func_void_int_short_void_ptr *)cb;
    event_active_nolock_(ev,0x40,1);
    psVar1 = &(ev->ev_evcallback).evcb_flags;
    *(byte *)psVar1 = (byte)*psVar1 | 0x40;
    if (peVar2->th_base_lock != (void *)0x0) {
      iVar3 = 0;
      (*evthread_lock_fns_.unlock)(0,peVar2->th_base_lock);
    }
  }
  return iVar3;
}

Assistant:

static int
event_finalize_impl_(unsigned flags, struct event *ev, event_finalize_callback_fn cb)
{
	int r;
	struct event_base *base = ev->ev_base;
	if (EVUTIL_FAILURE_CHECK(!base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return -1;
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	r = event_finalize_nolock_(base, flags, ev, cb);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}